

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uchar utf16_literal_to_utf8(uchar *input_pointer,uchar *input_end,uchar **output_pointer)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint second_code;
  uchar *second_sequence;
  uchar first_byte_mark;
  uchar sequence_length;
  uchar utf8_position;
  uchar utf8_length;
  uchar *first_sequence;
  ulong uStack_30;
  uint first_code;
  unsigned_long codepoint;
  uchar **output_pointer_local;
  uchar *input_end_local;
  uchar *input_pointer_local;
  
  second_sequence._4_1_ = 0;
  if (((long)input_end - (long)input_pointer < 6) ||
     ((uVar2 = parse_hex4(input_pointer + 2), 0xdbff < uVar2 && (uVar2 < 0xe000)))) {
LAB_00106958:
    input_pointer_local._7_1_ = '\0';
  }
  else {
    if ((uVar2 < 0xd800) || (0xdbff < uVar2)) {
      second_sequence._5_1_ = '\x06';
    }
    else {
      second_sequence._5_1_ = '\f';
      if (((((long)input_end - (long)(input_pointer + 6) < 6) || (input_pointer[6] != '\\')) ||
          (input_pointer[7] != 'u')) ||
         ((uVar3 = parse_hex4(input_pointer + 8), uVar3 < 0xdc00 || (0xdfff < uVar3))))
      goto LAB_00106958;
      uVar2 = ((uVar2 & 0x3ff) << 10 | uVar3 & 0x3ff) + 0x10000;
    }
    uStack_30 = (ulong)uVar2;
    if (uStack_30 < 0x80) {
      second_sequence._7_1_ = 1;
      second_sequence._6_1_ = second_sequence._7_1_;
    }
    else if (uStack_30 < 0x800) {
      second_sequence._7_1_ = 2;
      second_sequence._4_1_ = 0xc0;
      second_sequence._6_1_ = second_sequence._7_1_;
    }
    else if (uStack_30 < 0x10000) {
      second_sequence._7_1_ = 3;
      second_sequence._4_1_ = 0xe0;
      second_sequence._6_1_ = second_sequence._7_1_;
    }
    else {
      if (0x10ffff < uStack_30) goto LAB_00106958;
      second_sequence._7_1_ = 4;
      second_sequence._4_1_ = 0xf0;
      second_sequence._6_1_ = second_sequence._7_1_;
    }
    while( true ) {
      second_sequence._6_1_ = second_sequence._6_1_ - 1;
      bVar1 = (byte)uStack_30;
      if (second_sequence._6_1_ == 0) break;
      (*output_pointer)[second_sequence._6_1_] = bVar1 & 0xbf | 0x80;
      uStack_30 = uStack_30 >> 6;
    }
    if (second_sequence._7_1_ < 2) {
      **output_pointer = bVar1 & 0x7f;
    }
    else {
      **output_pointer = bVar1 | second_sequence._4_1_;
    }
    *output_pointer = *output_pointer + (int)(uint)second_sequence._7_1_;
    input_pointer_local._7_1_ = second_sequence._5_1_;
  }
  return input_pointer_local._7_1_;
}

Assistant:

static unsigned char utf16_literal_to_utf8(const unsigned char * const input_pointer, const unsigned char * const input_end, unsigned char **output_pointer)
{
    long unsigned int codepoint = 0;
    unsigned int first_code = 0;
    const unsigned char *first_sequence = input_pointer;
    unsigned char utf8_length = 0;
    unsigned char utf8_position = 0;
    unsigned char sequence_length = 0;
    unsigned char first_byte_mark = 0;

    if ((input_end - first_sequence) < 6)
    {
        /* input ends unexpectedly */
        goto fail;
    }

    /* get the first utf16 sequence */
    first_code = parse_hex4(first_sequence + 2);

    /* check that the code is valid */
    if (((first_code >= 0xDC00) && (first_code <= 0xDFFF)))
    {
        goto fail;
    }

    /* UTF16 surrogate pair */
    if ((first_code >= 0xD800) && (first_code <= 0xDBFF))
    {
        const unsigned char *second_sequence = first_sequence + 6;
        unsigned int second_code = 0;
        sequence_length = 12; /* \uXXXX\uXXXX */

        if ((input_end - second_sequence) < 6)
        {
            /* input ends unexpectedly */
            goto fail;
        }

        if ((second_sequence[0] != '\\') || (second_sequence[1] != 'u'))
        {
            /* missing second half of the surrogate pair */
            goto fail;
        }

        /* get the second utf16 sequence */
        second_code = parse_hex4(second_sequence + 2);
        /* check that the code is valid */
        if ((second_code < 0xDC00) || (second_code > 0xDFFF))
        {
            /* invalid second half of the surrogate pair */
            goto fail;
        }


        /* calculate the unicode codepoint from the surrogate pair */
        codepoint = 0x10000 + (((first_code & 0x3FF) << 10) | (second_code & 0x3FF));
    }
    else
    {
        sequence_length = 6; /* \uXXXX */
        codepoint = first_code;
    }

    /* encode as UTF-8
     * takes at maximum 4 bytes to encode:
     * 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
    if (codepoint < 0x80)
    {
        /* normal ascii, encoding 0xxxxxxx */
        utf8_length = 1;
    }
    else if (codepoint < 0x800)
    {
        /* two bytes, encoding 110xxxxx 10xxxxxx */
        utf8_length = 2;
        first_byte_mark = 0xC0; /* 11000000 */
    }
    else if (codepoint < 0x10000)
    {
        /* three bytes, encoding 1110xxxx 10xxxxxx 10xxxxxx */
        utf8_length = 3;
        first_byte_mark = 0xE0; /* 11100000 */
    }
    else if (codepoint <= 0x10FFFF)
    {
        /* four bytes, encoding 1110xxxx 10xxxxxx 10xxxxxx 10xxxxxx */
        utf8_length = 4;
        first_byte_mark = 0xF0; /* 11110000 */
    }
    else
    {
        /* invalid unicode codepoint */
        goto fail;
    }

    /* encode as utf8 */
    for (utf8_position = (unsigned char)(utf8_length - 1); utf8_position > 0; utf8_position--)
    {
        /* 10xxxxxx */
        (*output_pointer)[utf8_position] = (unsigned char)((codepoint | 0x80) & 0xBF);
        codepoint >>= 6;
    }
    /* encode first byte */
    if (utf8_length > 1)
    {
        (*output_pointer)[0] = (unsigned char)((codepoint | first_byte_mark) & 0xFF);
    }
    else
    {
        (*output_pointer)[0] = (unsigned char)(codepoint & 0x7F);
    }

    *output_pointer += utf8_length;

    return sequence_length;

fail:
    return 0;
}